

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O3

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_func_by_single_stl_str_Test<char32_t>::Body
          (iu_StringViewSplit_x_iutest_x_chain_func_by_single_stl_str_Test<char32_t> *this)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  size_type sVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int iVar6;
  char *in_R9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sv_hash;
  vector<unsigned_long,_std::allocator<unsigned_long>_> s_hash;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> s;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> sv;
  AssertionResult iutest_ar;
  allocator<char> local_2d9;
  AssertionHelper local_2d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_268;
  size_type local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_248;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_230;
  string local_210;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> local_1f0;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  bool local_1c0;
  undefined1 local_1b8 [32];
  anon_class_8_1_6accba98_for_f local_198;
  ios_base local_138 [264];
  
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::u32string::_M_construct<char32_t_const*>
            ((u32string *)&local_230,L"arikitari na_world!",L"");
  local_1f0._M_len = local_230._M_string_length;
  local_1f0._M_str = local_230._M_dataplus._M_p;
  local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_248,3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_2a8,3);
  local_268 = &local_258;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_268,L"_ ",L"");
  sVar4 = local_260;
  paVar2 = &local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2;
  if (local_268 == &local_258) {
    local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2._8_4_ = local_258._8_4_;
    local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2._12_4_ = local_258._12_4_;
    local_268 = paVar2;
  }
  local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._4_4_ =
       local_258._M_allocated_capacity._4_4_;
  local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       local_258._M_allocated_capacity._0_4_;
  local_2d8.m_part_result.super_iuCodeMessage.m_message._M_string_length = local_260;
  local_260 = 0;
  local_258._M_allocated_capacity._0_4_ = 0;
  pcVar3 = (pointer)(local_1b8 + 0x10);
  pcVar1 = local_268->_M_local_buf + sVar4 * 4;
  local_2d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_268;
  paVar5 = local_268;
  local_268 = &local_258;
  local_1b8._0_8_ = pcVar3;
  std::__cxx11::u32string::_M_construct<char32_t*>((u32string *)local_1b8,paVar5,pcVar1);
  local_198.s_hash = &local_248;
  detail::
  operator|<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:373:86),_false,_true,_nullptr>
            (&local_230,
             (split_helper_conv_func<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:373:86),_false,_false,_true>
              *)local_1b8);
  if ((pointer)local_1b8._0_8_ != pcVar3) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity * 4 + 4);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,
                    CONCAT44(local_258._M_allocated_capacity._4_4_,
                             local_258._M_allocated_capacity._0_4_) * 4 + 4);
  }
  local_288 = &local_278;
  std::__cxx11::u32string::_M_construct<char32_t_const*>((u32string *)&local_288,L"_ ",L"");
  sVar4 = local_280;
  paVar2 = &local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2;
  if (local_288 == &local_278) {
    local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2._8_4_ = local_278._8_4_;
    local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2._12_4_ = local_278._12_4_;
    local_288 = paVar2;
  }
  local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._4_4_ =
       local_278._M_allocated_capacity._4_4_;
  local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity._0_4_ =
       local_278._M_allocated_capacity._0_4_;
  local_2d8.m_part_result.super_iuCodeMessage.m_message._M_string_length = local_280;
  local_280 = 0;
  local_278._M_allocated_capacity._0_4_ = 0;
  pcVar1 = local_288->_M_local_buf + sVar4 * 4;
  local_2d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)local_288;
  paVar5 = local_288;
  local_288 = &local_278;
  local_1b8._0_8_ = pcVar3;
  std::__cxx11::u32string::_M_construct<char32_t*>((u32string *)local_1b8,paVar5,pcVar1);
  local_198.s_hash = &local_2a8;
  detail::
  operator|<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:376:87),_false,_true,_nullptr>
            (&local_1f0,
             (split_helper_conv_func<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:376:87),_false,_false,_true>
              *)local_1b8);
  if ((pointer)local_1b8._0_8_ != pcVar3) {
    operator_delete((void *)local_1b8._0_8_,local_1b8._16_8_ * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(local_2d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity * 4 + 4);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,
                    CONCAT44(local_278._M_allocated_capacity._4_4_,
                             local_278._M_allocated_capacity._0_4_) * 4 + 4);
  }
  if ((long)local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) goto LAB_00232e3a;
    iVar6 = bcmp(local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 (long)local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    local_1e0 = &local_1d0;
    local_1d8 = 0;
    local_1d0 = 0;
    local_1c0 = iVar6 == 0;
    if (local_1c0) goto LAB_00232e3a;
  }
  else {
    local_1c0 = false;
  }
  local_1d0 = 0;
  local_1d8 = 0;
  local_1e0 = &local_1d0;
  memset((iu_global_format_stringstream *)local_1b8,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
            (&local_210,(internal *)&local_1e0,
             (AssertionResult *)
             "std::equal(s_hash.begin(), s_hash.end(), sv_hash.begin(), sv_hash.end())","false",
             "true",in_R9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,local_210._M_dataplus._M_p,&local_2d9);
  local_2d8.m_part_result.super_iuCodeMessage.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
  ;
  local_2d8.m_part_result.super_iuCodeMessage.m_line = 0x17e;
  local_2d8.m_part_result.super_iuCodeMessage._44_4_ = 2;
  iutest::AssertionHelper::OnFixed(&local_2d8,(Fixed *)local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
      &local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
    operator_delete(local_2d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    local_2d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                    _M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_1e0 != &local_1d0) {
    operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
  }
LAB_00232e3a:
  if (local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2a8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2a8.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_248.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_last_by_stl_str)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(std::basic_string<char_type>(constant::space_underscore<char_type>())) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}